

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cc
# Opt level: O2

char * BN_bn2dec(BIGNUM *a)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int i;
  uint uVar4;
  uint8_t *puVar5;
  uint8_t *data;
  size_t len;
  ScopedCBB cbb;
  
  CBB_zero(&cbb.ctx_);
  iVar1 = CBB_init(&cbb.ctx_,0x10);
  if (iVar1 == 0) goto LAB_0016b071;
  iVar1 = CBB_add_u8(&cbb.ctx_,'\0');
  puVar5 = (uint8_t *)0x0;
  if (iVar1 == 0) goto LAB_0016b074;
  iVar1 = BN_is_zero((BIGNUM *)a);
  if (iVar1 == 0) {
    data = (uint8_t *)BN_dup(a);
    if ((BIGNUM *)data != (BIGNUM *)0x0) {
      while( true ) {
        iVar1 = BN_is_zero((BIGNUM *)data);
        if (iVar1 != 0) break;
        uVar3 = BN_div_word((BIGNUM *)data,10000000000000000000);
        if (uVar3 == 0xffffffffffffffff) goto LAB_0016b067;
        iVar1 = BN_is_zero((BIGNUM *)data);
        uVar4 = 0;
        while( true ) {
          if ((0x12 < uVar4) || (iVar1 != 0 && uVar3 == 0)) break;
          iVar2 = CBB_add_u8(&cbb.ctx_,(byte)(uVar3 % 10) | 0x30);
          if (iVar2 == 0) goto LAB_0016b067;
          uVar4 = uVar4 + 1;
          uVar3 = uVar3 / 10;
        }
        if (uVar3 != 0) {
          __assert_fail("word == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/convert.cc"
                        ,0xe6,"char *BN_bn2dec(const BIGNUM *)");
        }
      }
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&data);
      goto LAB_0016af49;
    }
LAB_0016b067:
    std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&data);
  }
  else {
    iVar1 = CBB_add_u8(&cbb.ctx_,'0');
    if (iVar1 != 0) {
LAB_0016af49:
      iVar1 = BN_is_negative((BIGNUM *)a);
      if (iVar1 != 0) {
        iVar1 = CBB_add_u8(&cbb.ctx_,'-');
        if (iVar1 == 0) goto LAB_0016b071;
      }
      iVar1 = CBB_finish(&cbb.ctx_,&data,&len);
      if (iVar1 != 0) {
        std::__reverse<unsigned_char*>(data,data + len);
        puVar5 = data;
        goto LAB_0016b074;
      }
    }
  }
LAB_0016b071:
  puVar5 = (uint8_t *)0x0;
LAB_0016b074:
  CBB_cleanup(&cbb.ctx_);
  return (char *)puVar5;
}

Assistant:

char *BN_bn2dec(const BIGNUM *a) {
  // It is easier to print strings little-endian, so we assemble it in reverse
  // and fix at the end.
  bssl::ScopedCBB cbb;
  if (!CBB_init(cbb.get(), 16) || //
      !CBB_add_u8(cbb.get(), 0 /* trailing NUL */)) {
    return nullptr;
  }

  if (BN_is_zero(a)) {
    if (!CBB_add_u8(cbb.get(), '0')) {
      return nullptr;
    }
  } else {
    bssl::UniquePtr<BIGNUM> copy(BN_dup(a));
    if (copy == nullptr) {
      return nullptr;
    }

    while (!BN_is_zero(copy.get())) {
      BN_ULONG word = BN_div_word(copy.get(), BN_DEC_CONV);
      if (word == (BN_ULONG)-1) {
        return nullptr;
      }

      const int add_leading_zeros = !BN_is_zero(copy.get());
      for (int i = 0; i < BN_DEC_NUM && (add_leading_zeros || word != 0); i++) {
        if (!CBB_add_u8(cbb.get(), '0' + word % 10)) {
          return nullptr;
        }
        word /= 10;
      }
      assert(word == 0);
    }
  }

  if (BN_is_negative(a) && //
      !CBB_add_u8(cbb.get(), '-')) {
    return nullptr;
  }

  uint8_t *data;
  size_t len;
  if (!CBB_finish(cbb.get(), &data, &len)) {
    return nullptr;
  }

  std::reverse(data, data + len);
  return reinterpret_cast<char *>(data);
}